

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O1

void __thiscall
solitaire::colliders::StockPileColliderTests_emptyCoveredCardsCollidesWith_Test::
StockPileColliderTests_emptyCoveredCardsCollidesWith_Test
          (StockPileColliderTests_emptyCoveredCardsCollidesWith_Test *this)

{
  StockPileMock *this_00;
  
  testing::Test::Test((Test *)this);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_00326488;
  this_00 = &(this->super_StockPileColliderTests).stockPileMock;
  piles::StockPileMock::StockPileMock(this_00);
  StockPileCollider::StockPileCollider
            (&(this->super_StockPileColliderTests).collider,&this_00->super_StockPile);
  (this->super_StockPileColliderTests).super_Test._vptr_Test =
       (_func_int **)&PTR__StockPileColliderTests_003260e8;
  return;
}

Assistant:

TEST_F(StockPileColliderTests, emptyCoveredCardsCollidesWith) {
    Cards noCards;
    EXPECT_CALL(stockPileMock, getCards()).WillRepeatedly(ReturnRef(noCards));
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillRepeatedly(Return(std::nullopt));

    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pilePosition - Position {1, 0}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pilePosition - Position {0, 1}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner + Position {1, 0}));
    EXPECT_FALSE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner + Position {0, 1}));
    EXPECT_TRUE(collider.coveredCardsCollidesWith(
        pilePosition));
    EXPECT_TRUE(collider.coveredCardsCollidesWith(
        pileBottomRightCorner));
}